

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O3

string * __thiscall
duckdb::Leaf::DeprecatedVerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Leaf *this,ART *art,Node *node,bool only_verify)

{
  byte bVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  ulong uVar4;
  bool bVar5;
  string *psVar6;
  uint uVar7;
  type paVar8;
  iterator iVar9;
  pointer this_00;
  data_ptr_t pdVar10;
  long *plVar11;
  undefined8 *puVar12;
  long *plVar13;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  undefined7 in_register_00000081;
  _func_int **pp_Var17;
  ulong __val;
  ulong uVar18;
  string str;
  string __str_1;
  string __str;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  byte *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined4 local_64;
  Leaf *local_60;
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_64 = SUB84(node,0);
  local_b0 = local_a0;
  local_60 = this;
  local_58 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,anon_var_dwarf_63f17de + 9,anon_var_dwarf_63f17de + 9,node,
             CONCAT71(in_register_00000081,only_verify));
  pp_Var17 = (art->super_BoundIndex).super_Index._vptr_Index;
  if ((ulong)pp_Var17 >> 0x38 != 0) {
    local_60 = (Leaf *)local_60[8].row_ids;
    do {
      paVar8 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*((shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                            *)local_60);
      _Var2._M_head_impl =
           paVar8->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_d0 = (long *)((ulong)pp_Var17 & 0xffffffff);
      iVar9 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_d0);
      this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                              *)((long)iVar9.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                       ._M_cur + 0x10));
      pdVar10 = FixedSizeBuffer::Get(this_00,false);
      local_90 = pdVar10 + (ulong)((uint)((ulong)pp_Var17 >> 0x20) & 0xffffff) *
                           (_Var2._M_head_impl)->segment_size;
      iVar3 = (_Var2._M_head_impl)->bitmask_offset;
      bVar1 = local_90[iVar3];
      uVar16 = 3 - (bVar1 < 100);
      if (bVar1 < 10) {
        uVar16 = 1;
      }
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar16);
      ::std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar16,(uint)bVar1);
      plVar11 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1385c70);
      plVar13 = plVar11 + 2;
      if ((long *)*plVar11 == plVar13) {
        local_78 = *plVar13;
        lStack_70 = plVar11[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar13;
        local_88 = (long *)*plVar11;
      }
      local_80 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)::std::__cxx11::string::append((char *)&local_88);
      plVar13 = plVar11 + 2;
      if ((long *)*plVar11 == plVar13) {
        local_c0 = *plVar13;
        lStack_b8 = plVar11[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar13;
        local_d0 = (long *)*plVar11;
      }
      local_c8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      pbVar15 = local_90;
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pbVar15 = pbVar15 + iVar3;
      if (*pbVar15 != 0) {
        uVar18 = 0;
        local_90 = pbVar15;
        do {
          uVar4 = *(ulong *)(pbVar15 + uVar18 * 8 + 8);
          __val = -uVar4;
          if (0 < (long)uVar4) {
            __val = uVar4;
          }
          uVar16 = 1;
          if (9 < __val) {
            uVar14 = __val;
            uVar7 = 4;
            do {
              uVar16 = uVar7;
              if (uVar14 < 100) {
                uVar16 = uVar16 - 2;
                goto LAB_00c0ea61;
              }
              if (uVar14 < 1000) {
                uVar16 = uVar16 - 1;
                goto LAB_00c0ea61;
              }
              if (uVar14 < 10000) goto LAB_00c0ea61;
              bVar5 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              uVar7 = uVar16 + 4;
            } while (bVar5);
            uVar16 = uVar16 + 1;
          }
LAB_00c0ea61:
          local_88 = &local_78;
          ::std::__cxx11::string::_M_construct
                    ((ulong)&local_88,(char)uVar16 - (char)((long)uVar4 >> 0x3f));
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)((long)local_88 - ((long)uVar4 >> 0x3f)),uVar16,__val);
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_88);
          plVar11 = puVar12 + 2;
          if ((long *)*puVar12 == plVar11) {
            local_c0 = *plVar11;
            lStack_b8 = puVar12[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar11;
            local_d0 = (long *)*puVar12;
          }
          local_c8 = puVar12[1];
          *puVar12 = plVar11;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
          pbVar15 = local_90;
          if (local_d0 != &local_c0) {
            operator_delete(local_d0);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < *pbVar15);
      }
      ::std::__cxx11::string::append((char *)&local_b0);
      pp_Var17 = *(_func_int ***)(pbVar15 + 0x28);
    } while ((_func_int **)0xffffffffffffff < pp_Var17);
  }
  psVar6 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  if ((char)local_64 == '\0') {
    ::std::__cxx11::string::_M_construct<char*>((string *)local_58,local_b0,local_b0 + local_a8);
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,anon_var_dwarf_63f17de + 9)
    ;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return psVar6;
}

Assistant:

string Leaf::DeprecatedVerifyAndToString(ART &art, const Node &node, const bool only_verify) {
	D_ASSERT(node.GetType() == LEAF);

	string str = "";
	reference<const Node> ref(node);

	while (ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		D_ASSERT(leaf.count <= LEAF_SIZE);

		str += "Leaf [count: " + to_string(leaf.count) + ", row IDs: ";
		for (uint8_t i = 0; i < leaf.count; i++) {
			str += to_string(leaf.row_ids[i]) + "-";
		}
		str += "] ";
		ref = leaf.ptr;
	}

	return only_verify ? "" : str;
}